

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3SegReaderStep(Fts3Table *p,Fts3MultiSegReader *pCsr)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int local_c8;
  int nWrite;
  char *a;
  char *aNew;
  sqlite3_int64 iDelta;
  sqlite3_int64 iDocid;
  int nByte;
  int nList;
  char *pList;
  char *pcStack_80;
  int j;
  sqlite3_int64 iPrev;
  Fts3SegReader *pFStack_70;
  int nDoclist;
  Fts3SegReader *pSeg;
  int i;
  int nMerge;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp;
  Fts3SegFilter *pFilter;
  Fts3SegReader **ppFStack_48;
  int nSegment;
  Fts3SegReader **apSegment;
  uint local_38;
  int isFirst;
  int isScan;
  int isPrefix;
  int isColFilter;
  int isRequirePos;
  int isIgnoreEmpty;
  int rc;
  Fts3MultiSegReader *pCsr_local;
  Fts3Table *p_local;
  
  isRequirePos = 0;
  isColFilter = pCsr->pFilter->flags & 2;
  isPrefix = pCsr->pFilter->flags & 1;
  isScan = pCsr->pFilter->flags & 4;
  isFirst = pCsr->pFilter->flags & 8;
  local_38 = pCsr->pFilter->flags & 0x10;
  apSegment._4_4_ = pCsr->pFilter->flags & 0x20;
  ppFStack_48 = pCsr->apSegment;
  pFilter._4_4_ = pCsr->nSegment;
  xCmp = (_func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *)pCsr->pFilter;
  _i = fts3SegReaderDoclistCmp;
  if (p->bDescIdx != '\0') {
    _i = fts3SegReaderDoclistCmpRev;
  }
  _isIgnoreEmpty = pCsr;
  pCsr_local = (Fts3MultiSegReader *)p;
  if (pCsr->nSegment == 0) {
    p_local._4_4_ = 0;
  }
  else {
    do {
      for (pSeg._0_4_ = 0; (int)pSeg < _isIgnoreEmpty->nAdvance; pSeg._0_4_ = (int)pSeg + 1) {
        pFStack_70 = ppFStack_48[(int)pSeg];
        if (pFStack_70->bLookup == '\0') {
          isRequirePos = fts3SegReaderNext((Fts3Table *)pCsr_local,pFStack_70,0);
        }
        else {
          fts3SegReaderSetEof(pFStack_70);
        }
        if (isRequirePos != 0) {
          return isRequirePos;
        }
      }
      fts3SegReaderSort(ppFStack_48,pFilter._4_4_,_isIgnoreEmpty->nAdvance,fts3SegReaderCmp);
      _isIgnoreEmpty->nAdvance = 0;
      if ((*ppFStack_48)->aNode == (char *)0x0) break;
      _isIgnoreEmpty->nTerm = (*ppFStack_48)->nTerm;
      _isIgnoreEmpty->zTerm = (*ppFStack_48)->zTerm;
      if (((*(long *)xCmp != 0) && (local_38 == 0)) &&
         ((_isIgnoreEmpty->nTerm < *(int *)(xCmp + 8) ||
          (((isFirst == 0 && (*(int *)(xCmp + 8) < _isIgnoreEmpty->nTerm)) ||
           (iVar2 = memcmp(_isIgnoreEmpty->zTerm,*(void **)xCmp,(long)*(int *)(xCmp + 8)),
           iVar2 != 0)))))) break;
      pSeg._4_4_ = 1;
      while( true ) {
        bVar4 = false;
        if (((pSeg._4_4_ < pFilter._4_4_) &&
            (bVar4 = false, ppFStack_48[pSeg._4_4_]->aNode != (char *)0x0)) &&
           (bVar4 = false, ppFStack_48[pSeg._4_4_]->nTerm == _isIgnoreEmpty->nTerm)) {
          iVar2 = memcmp(_isIgnoreEmpty->zTerm,ppFStack_48[pSeg._4_4_]->zTerm,
                         (long)_isIgnoreEmpty->nTerm);
          bVar4 = iVar2 == 0;
        }
        if (!bVar4) break;
        pSeg._4_4_ = pSeg._4_4_ + 1;
      }
      if (((pSeg._4_4_ == 1) && (isColFilter == 0)) &&
         ((apSegment._4_4_ == 0 &&
          ((*(char *)((long)&pCsr_local[5].nAdvance + 3) == '\0' ||
           ((*ppFStack_48)->ppNextElem == (Fts3HashElem **)0x0)))))) {
        _isIgnoreEmpty->nDoclist = (*ppFStack_48)->nDoclist;
        if ((*ppFStack_48)->ppNextElem == (Fts3HashElem **)0x0) {
          _isIgnoreEmpty->aDoclist = (*ppFStack_48)->aDoclist;
        }
        else {
          isRequirePos = fts3MsrBufferData(_isIgnoreEmpty,(*ppFStack_48)->aDoclist,
                                           _isIgnoreEmpty->nDoclist);
          _isIgnoreEmpty->aDoclist = _isIgnoreEmpty->aBuffer;
        }
        if (isRequirePos == 0) {
          isRequirePos = 100;
        }
      }
      else {
        iPrev._4_4_ = 0;
        pcStack_80 = (char *)0x0;
        for (pSeg._0_4_ = 0; (int)pSeg < pSeg._4_4_; pSeg._0_4_ = (int)pSeg + 1) {
          fts3SegReaderFirstDocid((Fts3Table *)pCsr_local,ppFStack_48[(int)pSeg]);
        }
        fts3SegReaderSort(ppFStack_48,pSeg._4_4_,pSeg._4_4_,_i);
        while ((*ppFStack_48)->pOffsetList != (char *)0x0) {
          _nByte = (char *)0x0;
          iDocid._4_4_ = 0;
          pcVar1 = (char *)(*ppFStack_48)->iDocid;
          fts3SegReaderNextDocid
                    ((Fts3Table *)pCsr_local,*ppFStack_48,(char **)&nByte,(int *)((long)&iDocid + 4)
                    );
          pList._4_4_ = 1;
          while( true ) {
            bVar4 = false;
            if ((pList._4_4_ < pSeg._4_4_) &&
               (bVar4 = false, ppFStack_48[pList._4_4_]->pOffsetList != (char *)0x0)) {
              bVar4 = (char *)ppFStack_48[pList._4_4_]->iDocid == pcVar1;
            }
            if (!bVar4) break;
            fts3SegReaderNextDocid
                      ((Fts3Table *)pCsr_local,ppFStack_48[pList._4_4_],(char **)0x0,(int *)0x0);
            pList._4_4_ = pList._4_4_ + 1;
          }
          if (isScan != 0) {
            fts3ColumnFilter(*(int *)(xCmp + 0xc),0,(char **)&nByte,(int *)((long)&iDocid + 4));
          }
          if ((isColFilter == 0) || (0 < iDocid._4_4_)) {
            if ((*(char *)((long)&pCsr_local[5].nAdvance + 3) == '\0') || (iPrev._4_4_ < 1)) {
              aNew = pcVar1 + -(long)pcStack_80;
            }
            else {
              aNew = pcStack_80 + -(long)pcVar1;
            }
            if (((long)aNew < 1) && ((0 < iPrev._4_4_ || (aNew != pcVar1)))) {
              return 0x10b;
            }
            iVar2 = sqlite3Fts3VarintLen((sqlite3_uint64)aNew);
            if (isPrefix == 0) {
              local_c8 = 0;
            }
            else {
              local_c8 = iDocid._4_4_ + 1;
            }
            iDocid._0_4_ = iVar2 + local_c8;
            if (_isIgnoreEmpty->nBuffer < iPrev._4_4_ + (int)iDocid) {
              _isIgnoreEmpty->nBuffer = (iPrev._4_4_ + (int)iDocid) * 2;
              pcVar3 = (char *)sqlite3_realloc(_isIgnoreEmpty->aBuffer,_isIgnoreEmpty->nBuffer);
              if (pcVar3 == (char *)0x0) {
                return 7;
              }
              _isIgnoreEmpty->aBuffer = pcVar3;
            }
            if (apSegment._4_4_ == 0) {
              iVar2 = sqlite3Fts3PutVarint(_isIgnoreEmpty->aBuffer + iPrev._4_4_,(sqlite_int64)aNew)
              ;
              iPrev._4_4_ = iVar2 + iPrev._4_4_;
              pcStack_80 = pcVar1;
              if (isPrefix != 0) {
                memcpy(_isIgnoreEmpty->aBuffer + iPrev._4_4_,_nByte,(long)iDocid._4_4_);
                iVar2 = iDocid._4_4_ + iPrev._4_4_;
                iPrev._4_4_ = iVar2 + 1;
                _isIgnoreEmpty->aBuffer[iVar2] = '\0';
              }
            }
            else {
              iVar2 = sqlite3Fts3FirstFilter
                                ((sqlite3_int64)aNew,_nByte,iDocid._4_4_,
                                 _isIgnoreEmpty->aBuffer + iPrev._4_4_);
              if (iVar2 != 0) {
                iPrev._4_4_ = iVar2 + iPrev._4_4_;
                pcStack_80 = pcVar1;
              }
            }
          }
          fts3SegReaderSort(ppFStack_48,pSeg._4_4_,pList._4_4_,_i);
        }
        if (0 < iPrev._4_4_) {
          _isIgnoreEmpty->aDoclist = _isIgnoreEmpty->aBuffer;
          _isIgnoreEmpty->nDoclist = iPrev._4_4_;
          isRequirePos = 100;
        }
      }
      _isIgnoreEmpty->nAdvance = pSeg._4_4_;
    } while (isRequirePos == 0);
    p_local._4_4_ = isRequirePos;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SegReaderStep(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr        /* Cursor object */
){
  int rc = SQLITE_OK;

  int isIgnoreEmpty =  (pCsr->pFilter->flags & FTS3_SEGMENT_IGNORE_EMPTY);
  int isRequirePos =   (pCsr->pFilter->flags & FTS3_SEGMENT_REQUIRE_POS);
  int isColFilter =    (pCsr->pFilter->flags & FTS3_SEGMENT_COLUMN_FILTER);
  int isPrefix =       (pCsr->pFilter->flags & FTS3_SEGMENT_PREFIX);
  int isScan =         (pCsr->pFilter->flags & FTS3_SEGMENT_SCAN);
  int isFirst =        (pCsr->pFilter->flags & FTS3_SEGMENT_FIRST);

  Fts3SegReader **apSegment = pCsr->apSegment;
  int nSegment = pCsr->nSegment;
  Fts3SegFilter *pFilter = pCsr->pFilter;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( pCsr->nSegment==0 ) return SQLITE_OK;

  do {
    int nMerge;
    int i;
  
    /* Advance the first pCsr->nAdvance entries in the apSegment[] array
    ** forward. Then sort the list in order of current term again.  
    */
    for(i=0; i<pCsr->nAdvance; i++){
      Fts3SegReader *pSeg = apSegment[i];
      if( pSeg->bLookup ){
        fts3SegReaderSetEof(pSeg);
      }else{
        rc = fts3SegReaderNext(p, pSeg, 0);
      }
      if( rc!=SQLITE_OK ) return rc;
    }
    fts3SegReaderSort(apSegment, nSegment, pCsr->nAdvance, fts3SegReaderCmp);
    pCsr->nAdvance = 0;

    /* If all the seg-readers are at EOF, we're finished. return SQLITE_OK. */
    assert( rc==SQLITE_OK );
    if( apSegment[0]->aNode==0 ) break;

    pCsr->nTerm = apSegment[0]->nTerm;
    pCsr->zTerm = apSegment[0]->zTerm;

    /* If this is a prefix-search, and if the term that apSegment[0] points
    ** to does not share a suffix with pFilter->zTerm/nTerm, then all 
    ** required callbacks have been made. In this case exit early.
    **
    ** Similarly, if this is a search for an exact match, and the first term
    ** of segment apSegment[0] is not a match, exit early.
    */
    if( pFilter->zTerm && !isScan ){
      if( pCsr->nTerm<pFilter->nTerm 
       || (!isPrefix && pCsr->nTerm>pFilter->nTerm)
       || memcmp(pCsr->zTerm, pFilter->zTerm, pFilter->nTerm) 
      ){
        break;
      }
    }

    nMerge = 1;
    while( nMerge<nSegment 
        && apSegment[nMerge]->aNode
        && apSegment[nMerge]->nTerm==pCsr->nTerm 
        && 0==memcmp(pCsr->zTerm, apSegment[nMerge]->zTerm, pCsr->nTerm)
    ){
      nMerge++;
    }

    assert( isIgnoreEmpty || (isRequirePos && !isColFilter) );
    if( nMerge==1 
     && !isIgnoreEmpty 
     && !isFirst 
     && (p->bDescIdx==0 || fts3SegReaderIsPending(apSegment[0])==0)
    ){
      pCsr->nDoclist = apSegment[0]->nDoclist;
      if( fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pCsr, apSegment[0]->aDoclist, pCsr->nDoclist);
        pCsr->aDoclist = pCsr->aBuffer;
      }else{
        pCsr->aDoclist = apSegment[0]->aDoclist;
      }
      if( rc==SQLITE_OK ) rc = SQLITE_ROW;
    }else{
      int nDoclist = 0;           /* Size of doclist */
      sqlite3_int64 iPrev = 0;    /* Previous docid stored in doclist */

      /* The current term of the first nMerge entries in the array
      ** of Fts3SegReader objects is the same. The doclists must be merged
      ** and a single term returned with the merged doclist.
      */
      for(i=0; i<nMerge; i++){
        fts3SegReaderFirstDocid(p, apSegment[i]);
      }
      fts3SegReaderSort(apSegment, nMerge, nMerge, xCmp);
      while( apSegment[0]->pOffsetList ){
        int j;                    /* Number of segments that share a docid */
        char *pList = 0;
        int nList = 0;
        int nByte;
        sqlite3_int64 iDocid = apSegment[0]->iDocid;
        fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
        j = 1;
        while( j<nMerge
            && apSegment[j]->pOffsetList
            && apSegment[j]->iDocid==iDocid
        ){
          fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
          j++;
        }

        if( isColFilter ){
          fts3ColumnFilter(pFilter->iCol, 0, &pList, &nList);
        }

        if( !isIgnoreEmpty || nList>0 ){

          /* Calculate the 'docid' delta value to write into the merged 
          ** doclist. */
          sqlite3_int64 iDelta;
          if( p->bDescIdx && nDoclist>0 ){
            iDelta = iPrev - iDocid;
          }else{
            iDelta = iDocid - iPrev;
          }
          if( iDelta<=0 && (nDoclist>0 || iDelta!=iDocid) ){
            return FTS_CORRUPT_VTAB;
          }
          assert( nDoclist>0 || iDelta==iDocid );

          nByte = sqlite3Fts3VarintLen(iDelta) + (isRequirePos?nList+1:0);
          if( nDoclist+nByte>pCsr->nBuffer ){
            char *aNew;
            pCsr->nBuffer = (nDoclist+nByte)*2;
            aNew = sqlite3_realloc(pCsr->aBuffer, pCsr->nBuffer);
            if( !aNew ){
              return SQLITE_NOMEM;
            }
            pCsr->aBuffer = aNew;
          }

          if( isFirst ){
            char *a = &pCsr->aBuffer[nDoclist];
            int nWrite;
           
            nWrite = sqlite3Fts3FirstFilter(iDelta, pList, nList, a);
            if( nWrite ){
              iPrev = iDocid;
              nDoclist += nWrite;
            }
          }else{
            nDoclist += sqlite3Fts3PutVarint(&pCsr->aBuffer[nDoclist], iDelta);
            iPrev = iDocid;
            if( isRequirePos ){
              memcpy(&pCsr->aBuffer[nDoclist], pList, nList);
              nDoclist += nList;
              pCsr->aBuffer[nDoclist++] = '\0';
            }
          }
        }

        fts3SegReaderSort(apSegment, nMerge, j, xCmp);
      }
      if( nDoclist>0 ){
        pCsr->aDoclist = pCsr->aBuffer;
        pCsr->nDoclist = nDoclist;
        rc = SQLITE_ROW;
      }
    }
    pCsr->nAdvance = nMerge;
  }while( rc==SQLITE_OK );

  return rc;
}